

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O1

RIFF_Chunk * Timidity::LoadRIFF(FILE *src)

{
  DWORD DVar1;
  RIFF_Chunk *this;
  BYTE *__ptr;
  size_t sVar2;
  uint uVar3;
  DWORD *data;
  
  this = (RIFF_Chunk *)operator_new(0x28);
  this->magic = 0;
  this->length = 0;
  *(undefined8 *)&this->subtype = 0;
  this->data = (BYTE *)0x0;
  this->child = (RIFF_Chunk *)0x0;
  this->next = (RIFF_Chunk *)0x0;
  fread(this,4,1,(FILE *)src);
  fread(&this->length,4,1,(FILE *)src);
  if (this->magic == 0x46464952) {
    uVar3 = this->length;
    __ptr = (BYTE *)malloc((ulong)uVar3);
    this->data = __ptr;
    if (__ptr != (BYTE *)0x0) {
      sVar2 = fread(__ptr,(ulong)uVar3,1,(FILE *)src);
      if (sVar2 != 1) {
        FreeRIFF(this);
        return (RIFF_Chunk *)0x0;
      }
      data = (DWORD *)this->data;
      DVar1 = this->magic;
      uVar3 = this->length;
      if (3 < uVar3 && (DVar1 == 0x5453494c || DVar1 == 0x46464952)) {
        this->subtype = *data;
        data = data + 1;
        uVar3 = uVar3 - 4;
      }
      if ((DVar1 != 0x5453494c) && (DVar1 != 0x46464952)) {
        return this;
      }
      LoadSubChunks(this,(BYTE *)data,uVar3);
      return this;
    }
  }
  RIFF_Chunk::~RIFF_Chunk(this);
  operator_delete(this,0x28);
  return (RIFF_Chunk *)0x0;
}

Assistant:

RIFF_Chunk *LoadRIFF(FILE *src)
{
	RIFF_Chunk *chunk;
	BYTE *subchunkData;
	DWORD subchunkDataLen;

	/* Allocate the chunk structure */
	chunk = new RIFF_Chunk;

	/* Make sure the file is in RIFF format */
	fread(&chunk->magic, 4, 1, src);
	fread(&chunk->length, 4, 1, src);
	chunk->length = LittleLong(chunk->length);
	if ( chunk->magic != RIFF ) {
		__Sound_SetError("Not a RIFF file");
		delete chunk;
		return NULL;
	}
	chunk->data = (BYTE *)malloc(chunk->length);
	if ( chunk->data == NULL ) {
		__Sound_SetError(ERR_OUT_OF_MEMORY);
		delete chunk;
		return NULL;
	}
	if ( fread(chunk->data, chunk->length, 1, src) != 1 ) {
		__Sound_SetError(ERR_IO_ERROR);
		FreeRIFF(chunk);
		return NULL;
	}
	subchunkData = chunk->data;
	subchunkDataLen = chunk->length;
	if ( ChunkHasSubType(chunk->magic) && subchunkDataLen >= 4 ) {
		chunk->subtype = *(DWORD *)subchunkData;
		subchunkData += 4;
		subchunkDataLen -= 4;
	}
	if ( ChunkHasSubChunks(chunk->magic) ) {
		LoadSubChunks(chunk, subchunkData, subchunkDataLen);
	}
	return chunk;
}